

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O0

void __thiscall tst_qpromise_convert::rejectUnconvertibleTypes(tst_qpromise_convert *this)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *this_00;
  Bar *this_01;
  initializer_list<int> __l;
  bool bVar1;
  byte bVar2;
  allocator<int> local_f1;
  int local_f0 [2];
  iterator local_e8;
  size_type local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  QPromise<std::vector<int,_std::allocator<int>_>_> local_c0;
  undefined1 local_b0 [8];
  QPromise<int> p_2;
  enable_if_t<std::is_copy_constructible_v<(anonymous_namespace)::Bar>,_QVariant> local_98;
  QPromise<QVariant> local_78;
  undefined1 local_68 [8];
  QPromise<QString> p_1;
  QString local_48;
  QPromise<QString> local_30;
  undefined1 local_20 [8];
  QPromise<int> p;
  tst_qpromise_convert *this_local;
  
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  QString::QString(&local_48,"42foo");
  QtPromise::resolve<QString>((QtPromise *)&local_30,&local_48);
  QtPromise::QPromise<QString>::convert<int>((QPromise<QString> *)local_20);
  QtPromise::QPromise<QString>::~QPromise(&local_30);
  QString::~QString(&local_48);
  bVar1 = waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<int>>
                    ((QPromise<int> *)local_20);
  bVar2 = QTest::qVerify(bVar1,"waitForRejected<QtPromise::QPromiseConversionException>(p)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                         ,0xf4);
  p_1.super_QPromiseBase<QString>.m_d.d._1_3_ = 0;
  p_1.super_QPromiseBase<QString>.m_d.d._0_1_ = (bVar2 & 1) == 0;
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  if ((uint)p_1.super_QPromiseBase<QString>.m_d.d == 0) {
    this_00 = &p_2.super_QPromiseBase<int>.m_d;
    anon_unknown.dwarf_36992::Foo::Foo((Foo *)this_00,0x2a);
    this_01 = (Bar *)((long)&p_2.super_QPromiseBase<int>.m_d.d + 4);
    anon_unknown.dwarf_36992::Bar::Bar(this_01,(Foo *)this_00);
    QVariant::fromValue<(anonymous_namespace)::Bar>(&local_98,this_01);
    QtPromise::resolve<QVariant>((QtPromise *)&local_78,&local_98);
    QtPromise::QPromise<QVariant>::convert<QString>((QPromise<QVariant> *)local_68);
    QtPromise::QPromise<QVariant>::~QPromise(&local_78);
    QVariant::~QVariant(&local_98);
    bVar1 = waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>
                      ((QPromise<QString> *)local_68);
    bVar2 = QTest::qVerify(bVar1,"waitForRejected<QtPromise::QPromiseConversionException>(p)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0xfd);
    p_1.super_QPromiseBase<QString>.m_d.d._1_3_ = 0;
    p_1.super_QPromiseBase<QString>.m_d.d._0_1_ = (bVar2 & 1) == 0;
    QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_68);
    if ((uint)p_1.super_QPromiseBase<QString>.m_d.d == 0) {
      local_f0[0] = 0x2a;
      local_f0[1] = 0xffffffd6;
      local_e8 = local_f0;
      local_e0 = 2;
      std::allocator<int>::allocator(&local_f1);
      __l._M_len = local_e0;
      __l._M_array = local_e8;
      std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l,&local_f1);
      QtPromise::resolve<std::vector<int,std::allocator<int>>>((QtPromise *)&local_c0,&local_d8);
      QtPromise::QPromise<std::vector<int,_std::allocator<int>_>_>::convert<int>
                ((QPromise<std::vector<int,_std::allocator<int>_>_> *)local_b0);
      QtPromise::QPromise<std::vector<int,_std::allocator<int>_>_>::~QPromise(&local_c0);
      std::vector<int,_std::allocator<int>_>::~vector(&local_d8);
      std::allocator<int>::~allocator(&local_f1);
      bVar1 = waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<int>>
                        ((QPromise<int> *)local_b0);
      bVar2 = QTest::qVerify(bVar1,"waitForRejected<QtPromise::QPromiseConversionException>(p)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                             ,0x106);
      p_1.super_QPromiseBase<QString>.m_d.d._1_3_ = 0;
      p_1.super_QPromiseBase<QString>.m_d.d._0_1_ = (bVar2 & 1) == 0;
      QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_b0);
    }
  }
  return;
}

Assistant:

void tst_qpromise_convert::rejectUnconvertibleTypes()
{
    // A string incompatible with int due to its value.
    {
        auto p = QtPromise::resolve(QString{"42foo"}).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QVERIFY(waitForRejected<QtPromise::QPromiseConversionException>(p));
    }

    // A user-defined type unconvertible to string because there is no converter.
    {
        auto p = QtPromise::resolve(QVariant::fromValue(Bar{42})).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QVERIFY(waitForRejected<QtPromise::QPromiseConversionException>(p));
    }

    // A standard library type unconvertible to a primitive type because there is no converter.
    {
        auto p = QtPromise::resolve(std::vector<int>{42, -42}).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QVERIFY(waitForRejected<QtPromise::QPromiseConversionException>(p));
    }
}